

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void matras_stats_test(void)

{
  void *pvVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined1 local_b8 [8];
  matras matras;
  matras_view view;
  matras_id_t mStack_38;
  matras_id_t id;
  matras_stats stats;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_stats_test");
  plan(0xc);
  mStack_38 = 0;
  id = 0;
  _ok(1,"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x123,
      "line %d",0x123);
  _ok(1,"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x124,
      "line %d",0x124);
  extents_in_use = 0;
  matras_create((matras *)local_b8,8,&ver_allocator,(matras_stats *)&stack0xffffffffffffffc8);
  _ok((uint)(mStack_38 == 0),"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x129,
      "line %d",0x129);
  _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12a,
      "line %d",0x12a);
  pvVar1 = matras_alloc((matras *)local_b8,(matras_id_t *)((long)&view.next_view + 4));
  if (pvVar1 == (void *)0x0) {
    pcVar2 = "matras_alloc(&matras, &id) != NULL";
    uVar3 = 0x12d;
  }
  else {
    _ok((uint)(mStack_38 == 3),"stats.extent_count == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12e,
        "line %d",0x12e);
    _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12f,
        "line %d",0x12f);
    matras_create_read_view((matras *)local_b8,(matras_view *)&matras.stats);
    pvVar1 = matras_touch((matras *)local_b8,view.next_view._4_4_);
    if (pvVar1 != (void *)0x0) {
      _ok((uint)(mStack_38 == 6),"stats.extent_count == 6",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x134
          ,"line %d",0x134);
      _ok((uint)(id == 3),"stats.read_view_extent_count == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x135
          ,"line %d",0x135);
      matras_destroy_read_view((matras *)local_b8,(matras_view *)&matras.stats);
      _ok((uint)(mStack_38 == 3),"stats.extent_count == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x138
          ,"line %d",0x138);
      _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x139
          ,"line %d",0x139);
      matras_destroy((matras *)local_b8);
      _ok((uint)(mStack_38 == 0),"stats.extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13c
          ,"line %d",0x13c);
      _ok((uint)(id == 0),"stats.read_view_extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13d
          ,"line %d",0x13d);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_stats_test");
      check_plan();
      return;
    }
    pcVar2 = "matras_touch(&matras, id) != NULL";
    uVar3 = 0x133;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar2,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",uVar3
          ,"matras_stats_test");
  exit(-1);
}

Assistant:

void
matras_stats_test()
{
	header();
	plan(12);

	struct matras_stats stats;
	matras_stats_create(&stats);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	extents_in_use = 0;
	struct matras matras;
	matras_create(&matras, sizeof(type_t), &ver_allocator, &stats);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	matras_id_t id;
	fail_unless(matras_alloc(&matras, &id) != NULL);
	ok(stats.extent_count == 3);
	ok(stats.read_view_extent_count == 0);

	struct matras_view view;
	matras_create_read_view(&matras, &view);
	fail_unless(matras_touch(&matras, id) != NULL);
	ok(stats.extent_count == 6);
	ok(stats.read_view_extent_count == 3);

	matras_destroy_read_view(&matras, &view);
	ok(stats.extent_count == 3);
	ok(stats.read_view_extent_count == 0);

	matras_destroy(&matras);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	footer();
	check_plan();
}